

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePagesInternal
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,uint index,uint pageCount)

{
  undefined4 *puVar1;
  char *pcVar2;
  PageAllocatorBaseCommon *pPVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  PreReservedVirtualAllocWrapper *this_00;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_01;
  undefined8 *in_FS_OFFSET;
  
  if (pageCount != 0) {
    uVar6 = GetAvailablePageCount(this);
    if (pageCount + index <= uVar6) goto LAB_0027fddf;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  *puVar1 = 1;
  bVar5 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                     ,0x242,
                     "(pageCount > 0 && (index + pageCount) <= this->GetAvailablePageCount())",
                     "pageCount > 0 && (index + pageCount) <= this->GetAvailablePageCount()");
  if (!bVar5) {
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  *puVar1 = 0;
LAB_0027fddf:
  BVStatic<272UL>::ClearRange(&this->freePages,index,pageCount);
  BVStatic<272UL>::SetRange(&this->decommitPages,index,pageCount);
  pcVar2 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
  pPVar3 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).super_SegmentBaseCommon
           .allocator;
  this_01 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
             *)&pPVar3[-1].allocatorType;
  if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
    this_01 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               *)0x0;
  }
  this_00 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
            ::GetVirtualAllocator(this_01);
  PreReservedVirtualAllocWrapper::Free
            (this_00,pcVar2 + (index << 0xc),(ulong)(pageCount << 0xc),0x4000);
  return;
}

Assistant:

void
PageSegmentBase<T>::DecommitFreePagesInternal(uint index, uint pageCount)
{
    Assert(pageCount > 0 && (index + pageCount) <= this->GetAvailablePageCount());
    this->ClearRangeInFreePagesBitVector(index, pageCount);
    this->SetRangeInDecommitPagesBitVector(index, pageCount);

    char * currentAddress = this->address + (index * AutoSystemInfo::PageSize);
#pragma warning(suppress: 6250)
    this->GetAllocator()->GetVirtualAllocator()->Free(currentAddress,
      pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
}